

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtSimpleBroadphase.h
# Opt level: O1

void __thiscall
cbtSimpleBroadphase::destroyProxy
          (cbtSimpleBroadphase *this,cbtBroadphaseProxy *proxyOrg,cbtDispatcher *dispatcher)

{
  int iVar1;
  
  iVar1 = (int)((ulong)((long)proxyOrg - (long)this->m_pHandles) >> 3) * -0x49249249;
  if (this->m_LastHandleIndex == iVar1) {
    this->m_LastHandleIndex = this->m_LastHandleIndex + -1;
  }
  *(int *)&proxyOrg->field_0x34 = this->m_firstFreeHandle;
  this->m_firstFreeHandle = iVar1;
  proxyOrg->m_clientObject = (void *)0x0;
  this->m_numHandles = this->m_numHandles + -1;
  (*(this->m_pairCache->super_cbtOverlappingPairCallback)._vptr_cbtOverlappingPairCallback[4])();
  return;
}

Assistant:

void freeHandle(cbtSimpleBroadphaseProxy* proxy)
	{
		int handle = int(proxy - m_pHandles);
		cbtAssert(handle >= 0 && handle < m_maxHandles);
		if (handle == m_LastHandleIndex)
		{
			m_LastHandleIndex--;
		}
		proxy->SetNextFree(m_firstFreeHandle);
		m_firstFreeHandle = handle;

		proxy->m_clientObject = 0;

		m_numHandles--;
	}